

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::EntryAnyRejectElementFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *this;
  JavascriptArray *this_00;
  JavascriptPromiseCapability *pJVar1;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RecyclableObject *newValue;
  JavascriptPromiseAnyRejectElementFunction *pJVar6;
  JavascriptError *pError;
  RecyclableObject *pRVar7;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1a1,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b9b92f;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_58,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1a2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00b9b92f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pRVar7 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  newValue = pRVar7;
  if ((local_58._0_4_ & 0xfffffe) != 0) {
    newValue = (RecyclableObject *)Arguments::operator[]((Arguments *)local_58,1);
  }
  pJVar6 = VarTo<Js::JavascriptPromiseAnyRejectElementFunction,Js::RecyclableObject>(function);
  if ((pJVar6->super_JavascriptPromiseAllResolveElementFunction).alreadyCalled == false) {
    (pJVar6->super_JavascriptPromiseAllResolveElementFunction).alreadyCalled = true;
    this_00 = (pJVar6->super_JavascriptPromiseAllResolveElementFunction).values.ptr;
    pJVar1 = (pJVar6->super_JavascriptPromiseAllResolveElementFunction).capabilities.ptr;
    JavascriptArray::DirectSetItemAt<void*>
              (this_00,(pJVar6->super_JavascriptPromiseAllResolveElementFunction).index,newValue);
    pJVar2 = (pJVar6->super_JavascriptPromiseAllResolveElementFunction).remainingElementsWrapper.ptr
    ;
    pJVar2->remainingElements = pJVar2->remainingElements - 1;
    if (pJVar2->remainingElements == 0) {
      pError = JavascriptLibrary::CreateAggregateError(this);
      JavascriptError::SetErrorsList(pError,this_00,scriptContext);
      JavascriptError::SetErrorMessage(pError,-0x7ff5ea0a,L"",scriptContext);
      pRVar7 = (RecyclableObject *)
               TryCallResolveOrRejectHandler((pJVar1->reject).ptr,pError,scriptContext);
    }
  }
  return pRVar7;
}

Assistant:

Var JavascriptPromise::EntryAnyRejectElementFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ScriptContext* scriptContext = function->GetScriptContext();
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var undefinedVar = library ->GetUndefined();
        Var x = args.Info.Count > 1 ? args[1] : undefinedVar;


        // 1. Let F be the active function object.
        JavascriptPromiseAnyRejectElementFunction* anyRejectElementFunction = VarTo<JavascriptPromiseAnyRejectElementFunction>(function);

        // 2. Let alreadyCalled be F. [[AlreadyCalled]].
        // 3. If alreadyCalled. [[Value]] is true, return undefined.
        if (anyRejectElementFunction->IsAlreadyCalled())
        {
            return undefinedVar;
        }

        // 4. Set alreadyCalled.[[Value]] to true.
        anyRejectElementFunction->SetAlreadyCalled(true);

        // 5. Let index be F.[[Index]].
        uint32 index = anyRejectElementFunction->GetIndex();

        // 6. Let errors be F.[[Errors]].
        JavascriptArray* errors = anyRejectElementFunction->GetValues();


        // 7. Let promiseCapability be F.[[Capability]].
        JavascriptPromiseCapability* promiseCapability = anyRejectElementFunction->GetCapabilities();

        // 9. Set errors[index] to x.
        errors->DirectSetItemAt(index, x);

        // 8. Let remainingElementsCount be F.[[RemainingElements]].
        // 10. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] - 1.
        // 11. If remainingElementsCount.[[Value]] is 0, then
        if (anyRejectElementFunction->DecrementRemainingElements() == 0)
        {
            // a. Let error be a newly created AggregateError object.
            JavascriptError* pError = library->CreateAggregateError();
            // b. Perform ! DefinePropertyOrThrow(error, "errors", Property Descriptor { [[Configurable]]: true, [[Enumerable]]: false, [[Writable]]: true, [[Value]]: ! CreateArrayFromList(errors) }).
            JavascriptError::SetErrorsList(pError, errors, scriptContext);
            JavascriptError::SetErrorMessage(pError, JSERR_PromiseAllRejected, _u(""), scriptContext);

            // c. Return ? Call(promiseCapability.[[Reject]], undefined, << error >> ).
            return TryCallResolveOrRejectHandler(promiseCapability->GetReject(), pError, scriptContext);
        }

        return undefinedVar;
    }